

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.h
# Opt level: O1

node<adj_ribs_in_data> *
add_prefix<adj_ribs_in_data>
          (node<adj_ribs_in_data> *root,uint32_t prefix,uint8_t prefix_len,adj_ribs_in_data data,
          bool *is_updated)

{
  bool bVar1;
  bool bVar2;
  node<adj_ribs_in_data> *pnVar3;
  node<adj_ribs_in_data> *pnVar4;
  adj_ribs_in_data *paVar5;
  uint8_t max_prefix_len;
  undefined7 in_register_00000011;
  byte n;
  node<adj_ribs_in_data> **ppnVar6;
  int iVar7;
  
  iVar7 = (int)CONCAT71(in_register_00000011,prefix_len) + -1;
  max_prefix_len = (uint8_t)iVar7;
  pnVar3 = search_prefix<adj_ribs_in_data>(root,prefix,max_prefix_len,false);
  n = pnVar3->prefix_len;
  for (; (int)(uint)n < iVar7; n = n + 1) {
    bVar1 = check_bit(prefix,n);
    pnVar4 = (&pnVar3->node_0)[bVar1];
    if (pnVar4 == (node<adj_ribs_in_data> *)0x0) {
      pnVar4 = (node<adj_ribs_in_data> *)malloc(0x30);
      if (pnVar4 == (node<adj_ribs_in_data> *)0x0) goto LAB_00112f1c;
      pnVar4->is_prefix = false;
      pnVar4->prefix = pnVar3->prefix;
      pnVar4->prefix_len = n + 1;
      pnVar4->parent = pnVar3;
      pnVar4->node_0 = (node<adj_ribs_in_data> *)0x0;
      pnVar4->node_1 = (node<adj_ribs_in_data> *)0x0;
      bVar1 = check_bit(prefix,n);
      if (bVar1) {
        ppnVar6 = &pnVar3->node_1;
        pnVar4->prefix = pnVar4->prefix | 0x80000000U >> (n & 0x1f);
      }
      else {
        ppnVar6 = &pnVar3->node_0;
      }
      *ppnVar6 = pnVar4;
    }
    pnVar3 = pnVar4;
  }
  bVar1 = check_bit(prefix,max_prefix_len);
  pnVar4 = (&pnVar3->node_0)[bVar1];
  if (pnVar4 == (node<adj_ribs_in_data> *)0x0) {
    pnVar4 = (node<adj_ribs_in_data> *)malloc(0x30);
    if (pnVar4 == (node<adj_ribs_in_data> *)0x0) goto LAB_00112f1c;
    pnVar4->is_prefix = true;
    pnVar4->prefix = pnVar3->prefix;
    bVar2 = check_bit(prefix,max_prefix_len);
    if (bVar2) {
      pnVar4->prefix = pnVar4->prefix | 1 << (-prefix_len & 0x1f);
    }
    pnVar4->prefix_len = prefix_len;
    paVar5 = (adj_ribs_in_data *)malloc(0x118);
    pnVar4->data = paVar5;
    if (paVar5 == (adj_ribs_in_data *)0x0) goto LAB_00112f1c;
    memcpy(paVar5,&data,0x118);
    pnVar4->parent = pnVar3;
    pnVar4->node_0 = (node<adj_ribs_in_data> *)0x0;
    pnVar4->node_1 = (node<adj_ribs_in_data> *)0x0;
    (&pnVar3->node_0)[bVar1] = pnVar4;
    if (is_updated != (bool *)0x0) {
      *is_updated = false;
    }
    goto LAB_00112f09;
  }
  if (pnVar4->is_prefix == true) {
    bVar2 = true;
    if (is_updated != (bool *)0x0) {
LAB_00112ed2:
      *is_updated = bVar2;
    }
  }
  else {
    pnVar4->is_prefix = true;
    if (is_updated != (bool *)0x0) {
      bVar2 = false;
      goto LAB_00112ed2;
    }
  }
  if (pnVar4->data == (adj_ribs_in_data *)0x0) {
    paVar5 = (adj_ribs_in_data *)malloc(0x118);
    pnVar4->data = paVar5;
    if ((&pnVar3->node_0)[bVar1]->data == (adj_ribs_in_data *)0x0) {
LAB_00112f1c:
      puts("Failed to allocate memory");
      exit(1);
    }
  }
  memcpy((&pnVar3->node_0)[bVar1]->data,&data,0x118);
LAB_00112f09:
  return (&pnVar3->node_0)[bVar1];
}

Assistant:

node<DATA_TYPE>* add_prefix(node<DATA_TYPE>* root, uint32_t prefix, uint8_t prefix_len, DATA_TYPE data, bool* is_updated = nullptr){
    node<DATA_TYPE>* current = search_prefix(root, prefix, prefix_len-1);
    uint8_t current_prefix_len = current->prefix_len;
#ifdef TEST_RIB_TREE_TEST_TREE
    printf("Get prefix: %d\n", current_prefix_len);
#endif
    node<DATA_TYPE>** growth_address_ptr;
    while(current_prefix_len < prefix_len - 1){ // 枝を伸ばす
        if(check_bit(prefix, current_prefix_len)){
            growth_address_ptr = &current->node_1;
        }else{
            growth_address_ptr = &current->node_0;
        }
        if((*growth_address_ptr) != nullptr){
            current = *growth_address_ptr;
        }else{
            auto* growth_node = (node<DATA_TYPE>*) malloc(sizeof(node<DATA_TYPE>));
            if(growth_node == nullptr){
                printf("Failed to allocate memory\n");
                exit(EXIT_FAILURE);
            }
            growth_node->is_prefix = false;
            growth_node->prefix = current->prefix;
            growth_node->prefix_len = current_prefix_len+1;
            growth_node->parent = current;
            growth_node->node_0 = nullptr;
            growth_node->node_1 = nullptr;
            if(check_bit(prefix, current_prefix_len)){
                growth_node->prefix |= (0b01 << (32 - (current_prefix_len + 1)));
                current->node_1 = growth_node;
            }else{
                current->node_0 = growth_node;
            }
#ifdef TEST_RIB_TREE_TEST_TREE
            printf("Create: %s/%d, %p\n", inet_ntoa(in_addr{.s_addr = htonl(growth_node->prefix)}), current_prefix_len+1, growth_node);
#endif
            current = growth_node;
        }
        current_prefix_len++;
    }

    if(check_bit(prefix, prefix_len - 1)){
        growth_address_ptr = &current->node_1;
    }else{
        growth_address_ptr = &current->node_0;
    }
    if((*growth_address_ptr) == nullptr){
        auto* new_prefix = (node<DATA_TYPE>*) malloc(sizeof(node<DATA_TYPE>));
        if(new_prefix == nullptr){
            printf("Failed to allocate memory\n");
            exit(EXIT_FAILURE);
        }
        new_prefix->is_prefix = true;
        new_prefix->prefix = current->prefix;
        if(check_bit(prefix, prefix_len-1)){
            new_prefix->prefix |= (0b01 << (32 - prefix_len));
        }
#ifdef TEST_RIB_TREE_TEST_TREE
        printf("Create Prefix: %s/%d, %p\n", inet_ntoa(in_addr{.s_addr = htonl(new_prefix->prefix)}), prefix_len, new_prefix);
#endif
        new_prefix->prefix_len = prefix_len;
        new_prefix->data = (DATA_TYPE*) malloc(sizeof(DATA_TYPE));
        if(new_prefix->data == nullptr){
            printf("Failed to allocate memory\n");
            exit(EXIT_FAILURE);
        }
        memcpy(new_prefix->data, &data, sizeof(DATA_TYPE));
        new_prefix->parent = current;
        new_prefix->node_0 = nullptr;
        new_prefix->node_1 = nullptr;
        *growth_address_ptr = new_prefix;
        if(is_updated != nullptr){
            *is_updated = false;
        }
    }else{
#ifdef TEST_RIB_TREE_TEST_TREE
        printf("Exist: %s/%d, %p\n", inet_ntoa(in_addr{.s_addr = htonl(prefix)}), prefix_len, (*growth_address_ptr));
#endif
        if((*growth_address_ptr)->is_prefix){
            if(is_updated != nullptr){
                *is_updated = true; // 書き込み先のノードがもともとプレフィックスだったら、それは経路の更新である
            }
        }else{
            (*growth_address_ptr)->is_prefix = true;
            if(is_updated != nullptr){
                *is_updated = false; // 書き込み先のノードがもともとプレフィックスでなかったら、それは経路の追加である
            }
        }
        if((*growth_address_ptr)->data == nullptr){
            (*growth_address_ptr)->data = (DATA_TYPE*) malloc(sizeof(DATA_TYPE));
            if((*growth_address_ptr)->data == nullptr){
                printf("Failed to allocate memory\n");
                exit(EXIT_FAILURE);
            }
        }
        memcpy((*growth_address_ptr)->data, &data, sizeof(DATA_TYPE));
    }

    return *growth_address_ptr;
}